

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

Simplex_handle __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::find<std::initializer_list<int>>
          (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *this,initializer_list<int> *s
          )

{
  undefined8 *in_RDX;
  vector<int,_std::allocator<int>_> copy;
  allocator_type local_31;
  _Vector_base<int,_std::allocator<int>_> local_30;
  
  if (in_RDX[1] == 0) {
    (this->nodes_label_to_list_)._M_h._M_buckets = (__buckets_ptr)0x0;
  }
  else {
    std::vector<int,std::allocator<int>>::vector<int_const*,void>
              ((vector<int,std::allocator<int>> *)&local_30,(int *)*in_RDX,
               (int *)*in_RDX + in_RDX[1],&local_31);
    std::
    __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (local_30._M_impl.super__Vector_impl_data._M_start,
               local_30._M_impl.super__Vector_impl_data._M_finish);
    find_simplex(this,(vector<int,_std::allocator<int>_> *)s);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_30);
  }
  return (Simplex_handle)
         (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
          *)this;
}

Assistant:

Simplex_handle find(const InputVertexRange & s) const {
    auto first = std::begin(s);
    auto last = std::end(s);

    if (first == last)
      return null_simplex();  // ----->>

    // Copy before sorting
    std::vector<Vertex_handle> copy(first, last);
    std::sort(std::begin(copy), std::end(copy));
    return find_simplex(copy);
  }